

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varsub.c
# Opt level: O1

void varsub(int qnum,int vnum,int flags)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  char (*pacVar5) [128];
  char *pcVar6;
  char (*pacVar7) [128];
  distribution *pdVar8;
  long lVar9;
  long lVar10;
  long tmp_date;
  long local_40;
  uint local_34;
  
  if (varsub_bInit == '\0') {
    local_34 = flags;
    sprintf(varsub::formats[4],"19%s-%s-01","%02ld","%02ld");
    sprintf(varsub::formats[5],"19%s-01-01","%02ld");
    sprintf(varsub::formats[6],"19%s-01-01","%02ld");
    sprintf(varsub::formats[7],"0.%s","%02ld");
    sprintf(varsub::formats[10],"19%s-%s-01","%02ld","%02ld");
    sprintf(varsub::formats[0xc],"19%s-01-01","%02ld");
    sprintf(varsub::formats[0xe],"19%s-%s-01","%02ld","%02ld");
    sprintf(varsub::formats[0xf],"19%s-%s-01","%02ld","%02ld");
    sprintf(varsub::formats[0x10],"Brand#%s%s","%ld","%ld");
    sprintf(varsub::formats[0x11],"Brand#%s%s","%ld","%ld");
    flags = local_34;
    sprintf(varsub::formats[0x13],"Brand#%s%s","%ld","%ld");
    sprintf(varsub::formats[0x14],"19%s-01-01","%02ld");
    varsub_bInit = '\x01';
  }
  if (vnum != 0) {
    if ((flags & 1U) == 0) {
      if ((10 < vnum) || (varsub::param[vnum][0] == '\0')) {
        pcVar6 = "Bad parameter request (q: %d, p: %d)\n";
LAB_0010620f:
        fprintf(_stderr,pcVar6,(ulong)(uint)qnum,(ulong)(uint)vnum);
        return;
      }
      pacVar7 = varsub::param + vnum;
    }
    else {
      if (vnum == 2 && qnum == 0xb) {
        fprintf(_stdout,"%11.10f",0.0001 / flt_scale);
        return;
      }
      pacVar7 = *(char (**) [128])((long)(qnum + -1) * 0x58 + 0x10da08 + (long)vnum * 8);
      if (pacVar7 == (char (*) [128])0x0) {
        pcVar6 = "Bad default request (q: %d, p: %d)\n";
        goto LAB_0010620f;
      }
    }
    fputs(*pacVar7,_stdout);
    return;
  }
  if ((flags & 1U) != 0) goto switchD_0010614e_caseD_17;
  switch(qnum) {
  case 1:
    lVar9 = 0x3c;
    lVar4 = 0x78;
    lVar10 = 1;
    goto LAB_001069f9;
  case 2:
    lVar10 = UnifInt(1,0x32,2);
    sprintf(varsub::param[1],"%ld",lVar10);
    pick_str(&p_types_set,2,varsub::param[3]);
    sVar3 = strlen(varsub::param[3]);
    pcVar6 = varsub::param[3] + (long)(int)sVar3 + 1;
    do {
      pcVar1 = pcVar6 + -2;
      pcVar6 = pcVar6 + -1;
    } while (*pcVar1 != ' ');
    strcpy(varsub::param[2],pcVar6);
    pdVar8 = &regions;
    iVar2 = 2;
    goto LAB_0010691e;
  case 3:
    pick_str(&c_mseg_set,3,varsub::param[1]);
    dss_random(&local_40,0,0x1e,3);
    strcpy(varsub::param[2],asc_date[local_40 + 0x483]);
    goto LAB_001069de;
  case 4:
    local_40 = UnifInt(0,0x39,4);
    lVar9 = -(local_40 >> 0x3f);
    lVar4 = local_40 / 0xc + (local_40 >> 0x3f);
    lVar10 = lVar4 + lVar9 + 0x5d;
    lVar4 = local_40 + (lVar4 + lVar9) * -0xc + 1;
    pacVar7 = varsub::formats + 4;
    goto LAB_00106a72;
  case 5:
    pick_str(&regions,5,varsub::param[1]);
    local_40 = UnifInt(0x5d,0x61,5);
    sprintf(varsub::param[2],varsub::formats[5],local_40);
    goto LAB_001069de;
  case 6:
    local_40 = UnifInt(0x5d,0x61,6);
    sprintf(varsub::param[1],varsub::formats[6],local_40);
    lVar10 = UnifInt(2,9,6);
    sprintf(varsub::param[2],varsub::formats[7],lVar10);
    lVar10 = UnifInt(0x18,0x19,6);
    pacVar7 = (char (*) [128])0x1070ea;
    goto LAB_00106597;
  case 7:
    iVar2 = pick_str(&nations2,7,varsub::param[1]);
    local_40 = (long)iVar2;
    pacVar5 = varsub::param + 3;
    do {
      iVar2 = pick_str(&nations2,7,varsub::param[2]);
    } while (local_40 == iVar2);
    break;
  case 8:
    iVar2 = pick_str(&nations2,8,varsub::param[1]);
    local_40 = nations.list[iVar2].weight;
    strcpy(varsub::param[2],regions.list[local_40].text);
    pdVar8 = &p_types_set;
    iVar2 = 8;
    goto LAB_0010691e;
  case 9:
    pdVar8 = &colors;
    iVar2 = 9;
    goto LAB_001069a4;
  case 10:
    local_40 = UnifInt(1,0x18,10);
    lVar9 = -(local_40 >> 0x3f);
    lVar4 = local_40 / 0xc + (local_40 >> 0x3f);
    lVar10 = lVar4 + lVar9 + 0x5d;
    lVar4 = local_40 + (lVar4 + lVar9) * -0xc + 1;
    pacVar7 = varsub::formats + 10;
    goto LAB_00106a72;
  case 0xb:
    pick_str(&nations2,0xb,varsub::param[1]);
    sprintf(varsub::param[2],"%11.10f",0.0001 / flt_scale);
    goto LAB_001069de;
  case 0xc:
    iVar2 = pick_str(&l_smode_set,0xc,varsub::param[1]);
    local_40 = (long)iVar2;
    do {
      lVar10 = local_40;
      iVar2 = pick_str(&l_smode_set,0xc,varsub::param[2]);
    } while (lVar10 == iVar2);
    lVar10 = UnifInt(0x5d,0x61,0xc);
    pacVar7 = varsub::formats + 0xc;
    local_40 = lVar10;
LAB_00106597:
    sprintf(varsub::param[3],*pacVar7,lVar10);
    goto LAB_00106923;
  case 0xd:
    pick_str(&q13a,0xd,varsub::param[1]);
    pdVar8 = &q13b;
    iVar2 = 0xd;
    goto LAB_001069d9;
  case 0xe:
    local_40 = UnifInt(0,0x3b,0xe);
    lVar9 = -(local_40 >> 0x3f);
    lVar4 = local_40 / 0xc + (local_40 >> 0x3f);
    lVar10 = lVar4 + lVar9 + 0x5d;
    lVar4 = local_40 + (lVar4 + lVar9) * -0xc + 1;
    pacVar7 = varsub::formats + 0xe;
    goto LAB_00106a72;
  case 0xf:
    local_40 = UnifInt(0,0x39,0xf);
    lVar9 = -(local_40 >> 0x3f);
    lVar4 = local_40 / 0xc + (local_40 >> 0x3f);
    lVar10 = lVar4 + lVar9 + 0x5d;
    lVar4 = local_40 + (lVar4 + lVar9) * -0xc + 1;
    pacVar7 = varsub::formats + 0xf;
LAB_00106a72:
    sprintf(varsub::param[1],*pacVar7,lVar10,lVar4);
LAB_00106a7c:
    pacVar5 = varsub::param + 2;
    break;
  case 0x10:
    lVar10 = UnifInt(1,5,0x10);
    lVar4 = UnifInt(1,5,0x10);
    sprintf(varsub::param[1],varsub::formats[0x10],lVar10,lVar4);
    pick_str(&p_types_set,0x10,varsub::param[2]);
    sVar3 = strlen(varsub::param[2]);
    pcVar6 = varsub::param[2] + (int)sVar3;
    do {
      pcVar1 = pcVar6 + -1;
      pcVar6 = pcVar6 + -1;
    } while (*pcVar1 != ' ');
    *pcVar6 = '\0';
    permute(sizes,0x32,0x10);
    pacVar7 = varsub::param + 3;
    lVar10 = 0;
    do {
      sprintf(*pacVar7,"%ld",*(undefined8 *)((long)sizes + lVar10));
      pacVar7 = pacVar7 + 1;
      lVar10 = lVar10 + 8;
    } while (lVar10 != 0x40);
    goto switchD_0010614e_caseD_17;
  case 0x11:
    lVar10 = UnifInt(1,5,0x11);
    lVar4 = UnifInt(1,5,0x11);
    sprintf(varsub::param[1],varsub::formats[0x11],lVar10,lVar4);
    pdVar8 = &p_cntr_set;
    iVar2 = 0x11;
LAB_001069d9:
    pick_str(pdVar8,iVar2,varsub::param[2]);
LAB_001069de:
    pacVar5 = varsub::param + 3;
    break;
  case 0x12:
    lVar9 = 0x138;
    lVar4 = 0x13b;
    lVar10 = 0x12;
LAB_001069f9:
    lVar10 = UnifInt(lVar9,lVar4,lVar10);
    sprintf(varsub::param[1],"%ld",lVar10);
    goto LAB_00106a7c;
  case 0x13:
    lVar10 = UnifInt(1,5,0x13);
    lVar4 = UnifInt(1,5,0x13);
    sprintf(varsub::param[1],varsub::formats[0x13],lVar10,lVar4);
    lVar10 = UnifInt(1,5,0x13);
    lVar4 = UnifInt(1,5,0x13);
    sprintf(varsub::param[2],varsub::formats[0x13],lVar10,lVar4);
    lVar10 = UnifInt(1,5,0x13);
    lVar4 = UnifInt(1,5,0x13);
    sprintf(varsub::param[3],varsub::formats[0x13],lVar10,lVar4);
    lVar10 = UnifInt(1,10,0x13);
    sprintf(varsub::param[4],"%ld",lVar10);
    lVar10 = UnifInt(10,0x14,0x13);
    sprintf(varsub::param[5],"%ld",lVar10);
    lVar10 = UnifInt(0x14,0x1e,0x13);
    sprintf(varsub::param[6],"%ld",lVar10);
    pacVar5 = varsub::param + 7;
    break;
  case 0x14:
    pick_str(&colors,0x14,varsub::param[1]);
    local_40 = UnifInt(0x5d,0x61,0x14);
    sprintf(varsub::param[2],varsub::formats[0x14],local_40);
    pdVar8 = &nations2;
    iVar2 = 0x14;
LAB_0010691e:
    pick_str(pdVar8,iVar2,varsub::param[3]);
LAB_00106923:
    pacVar5 = varsub::param + 4;
    break;
  case 0x15:
    pdVar8 = &nations2;
    iVar2 = 0x15;
LAB_001069a4:
    pick_str(pdVar8,iVar2,varsub::param[1]);
    goto LAB_00106a7c;
  case 0x16:
    local_34 = flags;
    permute(ccode,0x19,0x16);
    pacVar7 = varsub::param;
    pacVar5 = varsub::param + 8;
    lVar10 = 0;
    do {
      pacVar7 = pacVar7 + 1;
      sprintf(*pacVar7,"%ld",*(long *)((long)ccode + lVar10) + 10);
      lVar10 = lVar10 + 8;
      flags = local_34;
    } while (lVar10 != 0x40);
    break;
  case 0x17:
  case 0x18:
    goto switchD_0010614e_caseD_17;
  default:
    fprintf(_stderr,"No variable definitions available for query %d\n",(ulong)(uint)qnum);
    return;
  }
  (*pacVar5)[0] = '\0';
switchD_0010614e_caseD_17:
  if ((flags & 0x40U) != 0) {
    if ((varsub::lfp == (FILE *)0x0) &&
       (varsub::lfp = (FILE *)fopen64(lfile,"a"), (FILE *)varsub::lfp == (FILE *)0x0)) {
      varsub_cold_1();
      return;
    }
    fprintf((FILE *)varsub::lfp,"%d",(ulong)(uint)qnum);
    pacVar7 = varsub::param;
    lVar10 = 0;
    do {
      pacVar7 = pacVar7 + 1;
      if ((flags & 1U) == 0) {
        pacVar5 = pacVar7;
        if ((*pacVar7)[0] == '\0') break;
      }
      else {
        pacVar5 = (char (*) [128])defaults[qnum + -1][lVar10];
        if (pacVar5 == (char (*) [128])0x0) break;
      }
      fprintf((FILE *)varsub::lfp,"\t%s",pacVar5);
      lVar10 = lVar10 + 1;
    } while (lVar10 != 10);
    fputc(10,(FILE *)varsub::lfp);
  }
  return;
}

Assistant:

void
varsub(int qnum, int vnum, int flags)
{
    static char param[11][128];
    static char formats[23][128];
    static FILE *lfp = NULL;
    static int bInit = 0;
    long *lptr;
    char *ptr;
    int i = 0;
    DSS_HUGE tmp_date, tmp1, tmp2;
	
    if (!bInit)
    {
        sprintf(formats[4], "19%s-%s-01", HUGE_DATE_FORMAT, HUGE_DATE_FORMAT);
        sprintf(formats[5], "19%s-01-01", HUGE_DATE_FORMAT);
        sprintf(formats[6], "19%s-01-01", HUGE_DATE_FORMAT);
        sprintf(formats[7], "0.%s", HUGE_DATE_FORMAT); /* used by q6 */
        sprintf(formats[10], "19%s-%s-01", HUGE_DATE_FORMAT, HUGE_DATE_FORMAT);
        sprintf(formats[12], "19%s-01-01", HUGE_DATE_FORMAT);
        sprintf(formats[14], "19%s-%s-01", HUGE_DATE_FORMAT, HUGE_DATE_FORMAT);
        sprintf(formats[15], "19%s-%s-01", HUGE_DATE_FORMAT, HUGE_DATE_FORMAT);
	     sprintf(formats[16], "Brand#%s%s", HUGE_FORMAT, HUGE_FORMAT);
	     sprintf(formats[17], "Brand#%s%s", HUGE_FORMAT, HUGE_FORMAT);
	     sprintf(formats[19], "Brand#%s%s", HUGE_FORMAT, HUGE_FORMAT);
        sprintf(formats[20], "19%s-01-01", HUGE_DATE_FORMAT);
        bInit = 1;
    }

    if (vnum == 0)
    {
		if ((flags & DFLT) == 0)
		{
			switch(qnum)
			{
			case 1:
				sprintf(param[1], HUGE_FORMAT, UnifInt((DSS_HUGE)60,(DSS_HUGE)120,qnum));
				param[2][0] = '\0';
				break;
			case 2:
				sprintf(param[1], HUGE_FORMAT,
					UnifInt((DSS_HUGE)P_SIZE_MIN, (DSS_HUGE)P_SIZE_MAX, qnum));
				pick_str(&p_types_set, qnum, param[3]);
				ptr = param[3] + (int)strlen(param[3]);
				while (*(ptr - 1) != ' ') ptr--;
				strcpy(param[2], ptr);
				pick_str(&regions, qnum, param[3]);
				param[4][0] = '\0';
				break;
			case 3:
				pick_str(&c_mseg_set, qnum, param[1]);
				/*
				* pick a random offset within the month of march and add the
				* appropriate magic numbers to position the output functions 
				* at the start of March '95
				*/
            RANDOM(tmp_date, 0, 30, qnum);
				strcpy(param[2], *(asc_date + tmp_date + 1155));
				param[3][0] = '\0';
				break;
			case 4:
				tmp_date = UnifInt((DSS_HUGE)0,(DSS_HUGE)57,qnum);
				sprintf(param[1],formats[4],
					93 + tmp_date/12, tmp_date%12 + 1);
				param[2][0] = '\0';
				break;
			case 5:
				pick_str(&regions, qnum, param[1]);
				tmp_date = UnifInt((DSS_HUGE)93, (DSS_HUGE)97,qnum);
				sprintf(param[2], formats[5], tmp_date);
				param[3][0] = '\0';
				break;
			case 6:
				tmp_date = UnifInt((DSS_HUGE)93,(DSS_HUGE)97,qnum);
				sprintf(param[1], formats[6], tmp_date);
				sprintf(param[2], formats[7], 
                                    UnifInt((DSS_HUGE)2, (DSS_HUGE)9, qnum));
				sprintf(param[3], HUGE_FORMAT, UnifInt((DSS_HUGE)24, (DSS_HUGE)25, qnum));
				param[4][0] = '\0';
				break;
			case 7:
				tmp_date = pick_str(&nations2, qnum, param[1]);
				while (pick_str(&nations2, qnum, param[2]) == tmp_date);
				param[3][0] = '\0';
				break;
			case 8:
				tmp_date = pick_str(&nations2, qnum, param[1]);
				tmp_date = nations.list[tmp_date].weight;
				strcpy(param[2], regions.list[tmp_date].text);
				pick_str(&p_types_set, qnum, param[3]);
				param[4][0] = '\0';
				break;
			case 9:
				pick_str(&colors, qnum, param[1]);
				param[2][0] = '\0';
				break;
			case 10:
				tmp_date = UnifInt((DSS_HUGE)1,(DSS_HUGE)24,qnum);
				sprintf(param[1],formats[10],
					93 + tmp_date/12, tmp_date%12 + 1);
				param[2][0] = '\0';
				break;
			case 11:
				pick_str(&nations2, qnum, param[1]);
				sprintf(param[2], "%11.10f", Q11_FRACTION / flt_scale );
				param[3][0] = '\0';
				break;
			case 12:
				tmp_date = pick_str(&l_smode_set, qnum, param[1]);
				while (tmp_date == pick_str(&l_smode_set, qnum, param[2]));
				tmp_date = UnifInt((DSS_HUGE)93,(DSS_HUGE)97,qnum);
				sprintf(param[3], formats[12], tmp_date);
				param[4][0] = '\0';
				break;
			case 13:
				pick_str(&q13a, qnum, param[1]);
				pick_str(&q13b, qnum, param[2]);
				param[3][0] = '\0';
				break;
			case 14:
				tmp_date = UnifInt((DSS_HUGE)0,(DSS_HUGE)59,qnum);
				sprintf(param[1],formats[14],
					93 + tmp_date/12, tmp_date%12 + 1);
				param[2][0] = '\0';
				break;
			case 15:
				tmp_date = UnifInt((DSS_HUGE)0,(DSS_HUGE)57,qnum);
				sprintf(param[1],formats[15],
					93 + tmp_date/12, tmp_date%12 + 1);
				param[2][0] = '\0';
				break;
			case 16:
				tmp1 = UnifInt((DSS_HUGE)1, (DSS_HUGE)5, qnum); 
				tmp2 = UnifInt((DSS_HUGE)1, (DSS_HUGE)5, qnum);
				sprintf(param[1], formats[16], tmp1, tmp2);
				pick_str(&p_types_set, qnum, param[2]);
				ptr = param[2] + (int)strlen(param[2]);
				while (*(--ptr) != ' ');
				*ptr = '\0';
				lptr = &sizes[0];
				permute(lptr,50,qnum);
				for (i=3; i <= MAX_PARAM; i++)
					sprintf(param[i], "%ld", sizes[i - 3]);
				break;
			case 17:
				tmp1 = UnifInt((DSS_HUGE)1, (DSS_HUGE)5, qnum); 
				tmp2 = UnifInt((DSS_HUGE)1, (DSS_HUGE)5, qnum);
				sprintf(param[1], formats[17], tmp1, tmp2);
				pick_str(&p_cntr_set, qnum, param[2]);
				param[3][0] = '\0';
				break;
			case 18:
				sprintf(param[1], HUGE_FORMAT, UnifInt((DSS_HUGE)312, (DSS_HUGE)315, qnum));
				param[2][0] = '\0';
				break;
			case 19:
				tmp1 = UnifInt((DSS_HUGE)1, (DSS_HUGE)5, qnum); 
				tmp2 = UnifInt((DSS_HUGE)1, (DSS_HUGE)5, qnum);
				sprintf(param[1], formats[19], tmp1, tmp2);
				tmp1 = UnifInt((DSS_HUGE)1, (DSS_HUGE)5, qnum); 
				tmp2 = UnifInt((DSS_HUGE)1, (DSS_HUGE)5, qnum);
				sprintf(param[2], formats[19], tmp1, tmp2);
				tmp1 = UnifInt((DSS_HUGE)1, (DSS_HUGE)5, qnum); 
				tmp2 = UnifInt((DSS_HUGE)1, (DSS_HUGE)5, qnum);
				sprintf(param[3], formats[19], tmp1, tmp2);
				sprintf(param[4], HUGE_FORMAT, UnifInt((DSS_HUGE)1, (DSS_HUGE)10, qnum));
				sprintf(param[5], HUGE_FORMAT, UnifInt((DSS_HUGE)10, (DSS_HUGE)20, qnum));
				sprintf(param[6], HUGE_FORMAT, UnifInt((DSS_HUGE)20, (DSS_HUGE)30, qnum));
				param[7][0] = '\0';
				break;
			case 20:
				pick_str(&colors, qnum, param[1]);
				tmp_date = UnifInt((DSS_HUGE)93,(DSS_HUGE)97,qnum);
				sprintf(param[2], formats[20], tmp_date);
				pick_str(&nations2, qnum, param[3]);
				param[4][0] = '\0';
				break;
			case 21:
				pick_str(&nations2, qnum, param[1]);
				param[2][0] = '\0';
				break;
			case 22:
				lptr = &ccode[0];
				permute(lptr,25, qnum);
				for (i=0; i <= 7; i++)
					sprintf(param[i+1], "%ld", 10 + ccode[i]);
				param[8][0] = '\0';
				break;
			case 23:
			case 24:
                break;
			default:
				fprintf(stderr, 
					"No variable definitions available for query %d\n", 
                    qnum);
				return;
        }
    }
	
    if (flags & LOG)
	{
        if (lfp == NULL)
		{
            lfp = fopen(lfile, "a");
            OPEN_CHECK(lfp, lfile);
		}
        fprintf(lfp, "%d", qnum);
        for (i=1; i <= 10; i++)
            if (flags & DFLT)
			{
				if (defaults[qnum - 1][i - 1] == NULL)
					break;
				else
					fprintf(lfp, "\t%s", defaults[qnum - 1][i - 1]);
			}
            else
			{
				if (param[i][0] == '\0')
					break;
				else
					fprintf(lfp, "\t%s", param[i]);
			}
			fprintf(lfp, "\n");
	}
    }
    else
	{
        if (flags & DFLT)   
		{
            /* to allow -d to work at all scale factors */
            if (qnum == 11 && vnum == 2)
                fprintf(ofp, "%11.10f", Q11_FRACTION/flt_scale);
            else
                if (defaults[qnum - 1][vnum - 1])
                    fprintf(ofp, "%s", defaults[qnum - 1][vnum - 1]);
                else
					fprintf(stderr, 
					"Bad default request (q: %d, p: %d)\n",
					qnum, vnum);
		}
        else        
		{
            if (vnum <= MAX_PARAM && param[vnum][0] != '\0')
                fprintf(ofp, "%s", param[vnum]);
            else
				fprintf(stderr, "Bad parameter request (q: %d, p: %d)\n",
				qnum, vnum);
		}
	}
    return;
}